

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinM062X_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  int in_EDI;
  double in_R8;
  double in_R9;
  double in_XMM0_Qa;
  double lapl_i;
  double e;
  int32_t i;
  double in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinM062X_C>::eval_exc_unpolar
              (in_R8,in_R9,(double)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(double *)0x0);
    *(double *)((long)in_R9 + (long)iVar1 * 8) =
         in_XMM0_Qa * in_stack_ffffffffffffffb8 + *(double *)((long)in_R9 + (long)iVar1 * 8);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}